

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O0

void __thiscall
capnp::compiler::NodeTranslator::StructLayout::HoleSet<unsigned_char>::addHolesAtEnd
          (HoleSet<unsigned_char> *this,uchar lgSize,uchar offset,uchar limitLgSize)

{
  size_t sVar1;
  Fault local_40;
  Fault f_2;
  Fault f_1;
  Fault local_20;
  Fault f;
  uchar limitLgSize_local;
  uchar offset_local;
  uchar lgSize_local;
  HoleSet<unsigned_char> *this_local;
  
  f.exception._5_1_ = limitLgSize;
  f.exception._6_1_ = offset;
  f.exception._7_1_ = lgSize;
  sVar1 = kj::size<unsigned_char,6ul>(this->holes);
  if (sVar1 < limitLgSize) {
    kj::_::Debug::Fault::Fault
              (&local_20,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
               ,0x70,FAILED,"limitLgSize <= kj::size(holes)","");
    kj::_::Debug::Fault::fatal(&local_20);
  }
  while( true ) {
    if (f.exception._5_1_ <= f.exception._7_1_) {
      return;
    }
    if (this->holes[f.exception._7_1_] != '\0') break;
    if ((uint)f.exception._6_1_ % 2 != 1) {
      kj::_::Debug::Fault::Fault
                (&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
                 ,0x74,FAILED,"offset % 2 == 1","");
      kj::_::Debug::Fault::fatal(&local_40);
    }
    this->holes[f.exception._7_1_] = f.exception._6_1_;
    f.exception._7_1_ = f.exception._7_1_ + 1;
    f.exception._6_1_ = (byte)((ulong)(f.exception._6_1_ + 1) / 2);
  }
  kj::_::Debug::Fault::Fault
            (&f_2,
             "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compiler/node-translator.c++"
             ,0x73,FAILED,"holes[lgSize] == 0","");
  kj::_::Debug::Fault::fatal(&f_2);
}

Assistant:

void addHolesAtEnd(UIntType lgSize, UIntType offset,
                       UIntType limitLgSize = sizeof(HoleSet::holes) / sizeof(HoleSet::holes[0])) {
      // Add new holes of progressively larger sizes in the range [lgSize, limitLgSize) starting
      // from the given offset.  The idea is that you just allocated an lgSize-sized field from
      // an limitLgSize-sized space, such as a newly-added word on the end of the data segment.

      KJ_DREQUIRE(limitLgSize <= kj::size(holes));

      while (lgSize < limitLgSize) {
        KJ_DREQUIRE(holes[lgSize] == 0);
        KJ_DREQUIRE(offset % 2 == 1);
        holes[lgSize] = offset;
        ++lgSize;
        offset = (offset + 1) / 2;
      }
    }